

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

bool __thiscall DepsLog::RecordId(DepsLog *this,Node *node)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  void *__ptr;
  long lVar4;
  size_type sVar5;
  uint local_34;
  uint local_30;
  uint checksum;
  int id;
  uint size;
  int padding;
  int path_size;
  Node *node_local;
  DepsLog *this_local;
  
  _padding = node;
  node_local = (Node *)this;
  Node::path_abi_cxx11_(node);
  size = std::__cxx11::string::size();
  id = (4 - (int)size % 4) % 4;
  checksum = size + id + 4;
  if (checksum < 0x80000) {
    sVar3 = fwrite(&checksum,4,1,(FILE *)this->file_);
    if (sVar3 == 0) {
      this_local._7_1_ = false;
    }
    else {
      Node::path_abi_cxx11_(_padding);
      __ptr = (void *)std::__cxx11::string::data();
      sVar3 = fwrite(__ptr,(long)(int)size,1,(FILE *)this->file_);
      if (sVar3 == 0) {
        Node::path_abi_cxx11_(_padding);
        lVar4 = std::__cxx11::string::size();
        if (lVar4 == 0) {
          __assert_fail("node->path().size() > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/deps_log.cc"
                        ,0x192,"bool DepsLog::RecordId(Node *)");
        }
        this_local._7_1_ = false;
      }
      else {
        if ((id != 0) && (sVar3 = fwrite("",(long)id,1,(FILE *)this->file_), sVar3 == 0)) {
          return false;
        }
        sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&this->nodes_);
        local_30 = (uint)sVar5;
        local_34 = local_30 ^ 0xffffffff;
        sVar3 = fwrite(&local_34,4,1,(FILE *)this->file_);
        if (sVar3 == 0) {
          this_local._7_1_ = false;
        }
        else {
          iVar1 = fflush((FILE *)this->file_);
          if (iVar1 == 0) {
            Node::set_id(_padding,local_30);
            std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                      (&this->nodes_,(value_type *)&padding);
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x22;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DepsLog::RecordId(Node* node) {
  int path_size = node->path().size();
  int padding = (4 - path_size % 4) % 4;  // Pad path to 4 byte boundary.

  unsigned size = path_size + padding + 4;
  if (size > kMaxRecordSize) {
    errno = ERANGE;
    return false;
  }
  if (fwrite(&size, 4, 1, file_) < 1)
    return false;
  if (fwrite(node->path().data(), path_size, 1, file_) < 1) {
    assert(node->path().size() > 0);
    return false;
  }
  if (padding && fwrite("\0\0", padding, 1, file_) < 1)
    return false;
  int id = nodes_.size();
  unsigned checksum = ~(unsigned)id;
  if (fwrite(&checksum, 4, 1, file_) < 1)
    return false;
  if (fflush(file_) != 0)
    return false;

  node->set_id(id);
  nodes_.push_back(node);

  return true;
}